

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbvthandler_p.cpp
# Opt level: O3

void QFbVtHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == interrupted && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (pcVar1 == aboutToSuspend && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
      return;
    }
    if (pcVar1 == resumed && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      iVar3 = 0;
      break;
    case 1:
      iVar3 = 1;
      break;
    case 2:
      iVar3 = 2;
      break;
    case 3:
      handleSignal((QFbVtHandler *)_o);
      return;
    default:
      goto switchD_0011d8ac_default;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)0x0);
    return;
  }
switchD_0011d8ac_default:
  return;
}

Assistant:

void QFbVtHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbVtHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->interrupted(); break;
        case 1: _t->aboutToSuspend(); break;
        case 2: _t->resumed(); break;
        case 3: _t->handleSignal(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::interrupted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::aboutToSuspend, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::resumed, 2))
            return;
    }
}